

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.h
# Opt level: O0

void __thiscall
entityx::SystemManager::add<entityx::deps::Dependency<A,B,C>>
          (SystemManager *this,shared_ptr<entityx::deps::Dependency<A,_B,_C>_> *system)

{
  shared_ptr<entityx::deps::Dependency<A,_B,_C>_> *__y;
  long in_RDI;
  pair<unsigned_long,_std::shared_ptr<entityx::deps::Dependency<A,_B,_C>_>_> *__x;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  pair<unsigned_long,_std::shared_ptr<entityx::deps::Dependency<A,_B,_C>_>_> local_28;
  
  __y = (shared_ptr<entityx::deps::Dependency<A,_B,_C>_> *)(in_RDI + 0x18);
  System<entityx::deps::Dependency<A,_B,_C>_>::family();
  __x = &local_28;
  std::make_pair<unsigned_long,std::shared_ptr<entityx::deps::Dependency<A,B,C>>&>(&__x->first,__y);
  std::
  unordered_map<unsigned_long,std::shared_ptr<entityx::BaseSystem>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<entityx::BaseSystem>>>>
  ::insert<std::pair<unsigned_long,std::shared_ptr<entityx::deps::Dependency<A,B,C>>>>
            ((unordered_map<unsigned_long,_std::shared_ptr<entityx::BaseSystem>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),__x);
  Catch::clara::std::pair<unsigned_long,_std::shared_ptr<entityx::deps::Dependency<A,_B,_C>_>_>::
  ~pair((pair<unsigned_long,_std::shared_ptr<entityx::deps::Dependency<A,_B,_C>_>_> *)0x2c2468);
  return;
}

Assistant:

void add(std::shared_ptr<S> system) {
    systems_.insert(std::make_pair(S::family(), system));
  }